

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

char * p2sc_get_temp(char *key)

{
  int iVar1;
  p2sc_keyfile_t *k;
  char *group;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  undefined8 uVar5;
  char *tmp;
  char *rid;
  char *dir;
  char *top;
  p2sc_keyfile_t *kf;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  k = p2sc_open_keyfile(in_stack_ffffffffffffffd0);
  group = p2sc_get_keyvalue(k,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  pcVar2 = p2sc_get_keyvalue(k,group,in_stack_ffffffffffffffe0);
  pcVar3 = p2sc_get_string(in_stack_ffffffffffffffb8);
  pcVar3 = (char *)g_build_filename(group,pcVar2,pcVar3,0);
  iVar1 = g_mkdir_with_parents(pcVar3,0x1ed);
  if (iVar1 != 0) {
    piVar4 = __errno_location();
    uVar5 = g_strerror(*piVar4);
    _p2sc_msg("p2sc_get_temp",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x55,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"mkdir(%s): %s",
              pcVar3,uVar5);
    exit(1);
  }
  g_free(pcVar2);
  g_free(group);
  return pcVar3;
}

Assistant:

char *p2sc_get_temp(const char *key) {
    p2sc_keyfile_t *kf = p2sc_open_keyfile(P2SC_GLOBAL_INI);

    char *top = p2sc_get_keyvalue(kf, "dir", "top");
    char *dir = p2sc_get_keyvalue(kf, "dir", key);
    const char *rid = p2sc_get_string("runid");
    char *tmp = g_build_filename(top, dir, rid, NULL);

    if (g_mkdir_with_parents(tmp, 0755))
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "mkdir(%s): %s", tmp, g_strerror(errno));

    g_free(dir);
    g_free(top);

    return tmp;
}